

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void * PAL_LOADLoadPEFile(HANDLE hFile)

{
  char *__s;
  size_t sVar1;
  char *envVar;
  void *loadedBase;
  HANDLE hFile_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  envVar = (char *)MAPMapPEFile(hFile);
  if (((envVar != (char *)0x0) && (__s = getenv("PAL_ForcePEMapFailure"), __s != (char *)0x0)) &&
     (sVar1 = strlen(__s), sVar1 != 0)) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    PAL_LOADUnloadPEFile(envVar);
    envVar = (char *)MAPMapPEFile(hFile);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return envVar;
  }
  abort();
}

Assistant:

void *
PALAPI
PAL_LOADLoadPEFile(HANDLE hFile)
{
    ENTRY("PAL_LOADLoadPEFile (hFile=%p)\n", hFile);

    void * loadedBase = MAPMapPEFile(hFile);

#ifdef _DEBUG
    if (loadedBase != nullptr)
    {
        char* envVar = getenv("PAL_ForcePEMapFailure");
        if (envVar && strlen(envVar) > 0)
        {
            TRACE("Forcing failure of PE file map, and retry\n");
            PAL_LOADUnloadPEFile(loadedBase); // unload it
            loadedBase = MAPMapPEFile(hFile); // load it again
        }
    }
#endif // _DEBUG

    LOGEXIT("PAL_LOADLoadPEFile returns %p\n", loadedBase);
    return loadedBase;
}